

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O1

void __thiscall despot::Logger::InitRound(Logger *this,State *state)

{
  ostream *poVar1;
  char cVar2;
  int iVar3;
  log_ostream *plVar4;
  
  this->step_ = 0;
  if (state != (State *)0x0) {
    this->state_ = state;
    iVar3 = logging::level();
    if (0 < iVar3) {
      iVar3 = logging::level();
      if (2 < iVar3) {
        plVar4 = logging::stream(3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar4->super_ostream,"[POMDPLogger::InitRound] Created start state.",0x2d);
        std::ios::widen((char)(plVar4->super_ostream)._vptr_basic_ostream[-3] + (char)plVar4);
        std::ostream::put((char)plVar4);
        std::ostream::flush();
      }
    }
    if (((DAT_00193e30 == '\0') && (poVar1 = this->out_, poVar1 != (ostream *)0x0)) &&
       (this->state_ != (State *)0x0)) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Initial state: ",0xf);
      std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      (*this->world_->_vptr_World[5])(this->world_,this->state_,this->out_);
      cVar2 = (char)this->out_;
      std::ios::widen((char)this->out_->_vptr_basic_ostream[-3] + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
    }
  }
  this->total_discounted_reward_ = 0.0;
  this->total_undiscounted_reward_ = 0.0;
  return;
}

Assistant:

void Logger::InitRound(State* state) {
	step_ = 0;

	if (state) {
		state_ = state;
		logi << "[POMDPLogger::InitRound] Created start state." << endl;
		// Print initial state
		if (!Globals::config.silence && out_) {

			if (state_){
				*out_ << "Initial state: " << endl;
				world_->PrintState(*state_, *out_);
				*out_ << endl;
			}
		}
	}

	total_discounted_reward_ = 0;
	total_undiscounted_reward_ = 0;
}